

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcBinaryStream.h
# Opt level: O0

void __thiscall GrcDiversion::undivert(GrcDiversion *this)

{
  long lVar1;
  long lVar2;
  string *in_RDI;
  allocator local_79;
  string local_78 [48];
  string local_48 [32];
  string local_28 [40];
  
  if (*(long *)(in_RDI + 0x68) != 0) {
    std::ostream::flush();
    std::ios::rdbuf((streambuf *)
                    ((long)*(long **)(in_RDI + 0x70) + *(long *)(**(long **)(in_RDI + 0x70) + -0x18)
                    ));
    lVar1 = *(long *)(in_RDI + 0x70);
    std::__cxx11::stringbuf::str();
    lVar2 = std::__cxx11::string::data();
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::size();
    std::ostream::write((char *)(lVar1 + 0x10),lVar2);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_28);
    std::ostream::flush();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"",&local_79);
    std::__cxx11::stringbuf::str(in_RDI);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    *(undefined8 *)(in_RDI + 0x68) = 0;
  }
  return;
}

Assistant:

void undivert()
    {
        if (m_sbSaved)
        {
            m_strm.flush();
            m_strm.rdbuf(m_sbSaved);
            m_strm.write(str().data(), str().size());
            m_strm.flush();
            str("");
            m_sbSaved = 0;
        }
    }